

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<Fad<double>_>::Decompose_Cholesky(TPZMatrix<Fad<double>_> *this)

{
  double dVar1;
  char cVar2;
  double dVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int extraout_var;
  double *pdVar8;
  long lVar9;
  EVP_PKEY_CTX *pEVar10;
  double *pdVar11;
  int sz_1;
  long lVar12;
  int sz;
  ulong uVar13;
  ulong uVar14;
  Fad<double> sum;
  Fad<double> tmp;
  long local_130;
  Fad<double> local_128;
  undefined1 local_108 [16];
  EVP_PKEY_CTX *local_f8;
  double *pdStack_f0;
  double local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  double *local_c8;
  double local_c0;
  Fad<double> local_b8;
  long local_98;
  long local_90;
  undefined1 local_88 [16];
  double *local_78;
  double local_70;
  Fad<double> local_68;
  double local_48;
  undefined8 uStack_40;
  
  cVar2 = (this->super_TPZBaseMatrix).fDecomposed;
  if ((cVar2 != '\0') && (cVar2 != '\x03')) {
    Error("Decompose_Cholesky <Matrix already Decomposed>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    if ((this->super_TPZBaseMatrix).fRow != (this->super_TPZBaseMatrix).fCol) {
      Error("Decompose_Cholesky <Matrix must be square>",(char *)0x0);
    }
    iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    local_98 = CONCAT44(extraout_var,iVar7);
    if (local_98 != 0 && -1 < extraout_var) {
      lVar9 = 0;
      do {
        local_e0 = lVar9;
        if (lVar9 != 0) {
          lVar12 = 0;
          do {
            local_108._0_8_ = 0.0;
            local_108._8_4_ = 0;
            local_f8 = (EVP_PKEY_CTX *)0x0;
            pdStack_f0 = (double *)0x0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_128,this,lVar9,lVar12);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_b8,this,lVar9,lVar12);
            local_d8._0_8_ = &local_128;
            local_d8._8_8_ = &local_b8;
            Fad<double>::operator+=
                      ((Fad<double> *)local_108,
                       (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_d8);
            Fad<double>::~Fad(&local_b8);
            Fad<double>::~Fad(&local_128);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_b8,this,lVar9);
            iVar7 = local_b8.dx_.num_elts;
            uVar5 = local_108._8_4_;
            local_128.val_ = local_b8.val_ - (double)local_108._0_8_;
            uVar4 = local_108._8_4_;
            if ((int)local_108._8_4_ < local_b8.dx_.num_elts) {
              uVar4 = local_b8.dx_.num_elts;
            }
            local_128.dx_.num_elts = 0;
            local_128.dx_.ptr_to_data = (double *)0x0;
            if (0 < (int)uVar4) {
              uVar14 = (ulong)uVar4;
              local_128.dx_.num_elts = uVar4;
              local_128.dx_.ptr_to_data = (double *)operator_new__(uVar14 * 8);
              if (0 < (int)uVar4) {
                lVar9 = 0;
                do {
                  pdVar8 = (double *)((long)local_b8.dx_.ptr_to_data + lVar9);
                  if (iVar7 == 0) {
                    pdVar8 = &local_b8.defaultVal;
                  }
                  pEVar10 = local_f8 + lVar9;
                  if (uVar5 == 0) {
                    pEVar10 = (EVP_PKEY_CTX *)&pdStack_f0;
                  }
                  *(double *)((long)local_128.dx_.ptr_to_data + lVar9) =
                       *pdVar8 - (double)*(double **)pEVar10;
                  lVar9 = lVar9 + 8;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
            }
            lVar9 = local_e0;
            local_128.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,local_e0,local_e0,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad(&local_b8);
            Fad<double>::~Fad((Fad<double> *)local_108);
            lVar12 = lVar12 + 1;
          } while (lVar12 != lVar9);
        }
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<double> *)local_d8,this,lVar9,lVar9);
        FadFuncSqrt<Fad<double>_>::FadFuncSqrt
                  ((FadFuncSqrt<Fad<double>_> *)&local_128,(Fad<double> *)local_d8);
        FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                  ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_108,
                   (FadFuncSqrt<Fad<double>_> *)&local_128);
        Fad<double>::~Fad(&local_128);
        dVar1 = (double)CONCAT44(local_108._12_4_,local_108._8_4_);
        if (dVar1 < 0.0) {
          local_b8.val_ = sqrt(dVar1);
        }
        else {
          local_b8.val_ = SQRT(dVar1);
        }
        uVar4 = (uint)local_f8;
        local_b8.dx_.num_elts = 0;
        local_b8.dx_.ptr_to_data = (double *)0x0;
        if ((long)(int)(uint)local_f8 < 1) {
          local_b8.defaultVal = 0.0;
        }
        else {
          local_b8.dx_.num_elts = (uint)local_f8;
          uVar14 = (long)(int)(uint)local_f8 << 3;
          local_b8.dx_.ptr_to_data = (double *)operator_new__(uVar14);
          local_b8.defaultVal = 0.0;
          if (0 < (int)uVar4) {
            uVar13 = 0;
            do {
              pdVar8 = (double *)((long)pdStack_f0 + uVar13);
              if ((uint)local_f8 == 0) {
                pdVar8 = &local_e8;
              }
              dVar1 = *pdVar8;
              dVar3 = (double)CONCAT44(local_108._12_4_,local_108._8_4_);
              if (dVar3 < 0.0) {
                dVar3 = sqrt(dVar3);
              }
              else {
                dVar3 = SQRT(dVar3);
              }
              *(double *)((long)local_b8.dx_.ptr_to_data + uVar13) = dVar1 / (dVar3 + dVar3);
              uVar13 = uVar13 + 8;
            } while (uVar14 != uVar13);
          }
        }
        Fad<double>::~Fad((Fad<double> *)(local_108 + 8));
        Fad<double>::~Fad((Fad<double> *)local_d8);
        lVar9 = local_e0;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,local_e0,local_e0,&local_b8);
        local_130 = lVar9 + 1;
        local_90 = local_130;
        if (local_130 < local_98) {
          do {
            if (lVar9 != 0) {
              lVar12 = 0;
              do {
                local_108._0_8_ = 0.0;
                local_108._8_4_ = 0;
                local_f8 = (EVP_PKEY_CTX *)0x0;
                pdStack_f0 = (double *)0x0;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_128,this,lVar9,lVar12);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          ((Fad<double> *)local_d8,this,local_130,lVar12);
                local_88._0_8_ = &local_128;
                local_88._8_8_ = (Fad<double> *)local_d8;
                Fad<double>::operator+=
                          ((Fad<double> *)local_108,
                           (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_88);
                Fad<double>::~Fad((Fad<double> *)local_d8);
                Fad<double>::~Fad(&local_128);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          ((Fad<double> *)local_d8,this,lVar9);
                uVar5 = local_108._8_4_;
                local_128.val_ = (double)local_d8._0_8_ - (double)local_108._0_8_;
                uVar6 = local_d8._8_4_;
                uVar4 = local_108._8_4_;
                if ((int)local_108._8_4_ < (int)local_d8._8_4_) {
                  uVar4 = local_d8._8_4_;
                }
                local_128.dx_.num_elts = 0;
                local_128.dx_.ptr_to_data = (double *)0x0;
                if (0 < (int)uVar4) {
                  uVar14 = (ulong)uVar4;
                  local_128.dx_.num_elts = uVar4;
                  local_128.dx_.ptr_to_data = (double *)operator_new__(uVar14 * 8);
                  if (0 < (int)uVar4) {
                    lVar9 = 0;
                    do {
                      pdVar8 = (double *)((long)local_c8 + lVar9);
                      if (uVar6 == 0) {
                        pdVar8 = &local_c0;
                      }
                      pEVar10 = local_f8 + lVar9;
                      if (uVar5 == 0) {
                        pEVar10 = (EVP_PKEY_CTX *)&pdStack_f0;
                      }
                      *(double *)((long)local_128.dx_.ptr_to_data + lVar9) =
                           *pdVar8 - (double)*(double **)pEVar10;
                      lVar9 = lVar9 + 8;
                      uVar14 = uVar14 - 1;
                    } while (uVar14 != 0);
                  }
                }
                lVar9 = local_e0;
                local_128.defaultVal = 0.0;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,local_e0,local_130,&local_128);
                Fad<double>::~Fad(&local_128);
                Fad<double>::~Fad((Fad<double> *)local_d8);
                Fad<double>::~Fad((Fad<double> *)local_108);
                lVar12 = lVar12 + 1;
              } while (lVar12 != lVar9);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_108,this,lVar9,lVar9);
            uVar5 = local_108._8_4_;
            local_68.val_ = (double)local_108._0_8_;
            local_68.dx_.num_elts = local_108._8_4_;
            local_68.dx_.ptr_to_data = (double *)0x0;
            if ((long)(int)local_108._8_4_ != 0) {
              uVar14 = (long)(int)local_108._8_4_ * 8;
              if ((int)local_108._8_4_ < 0) {
                uVar14 = 0xffffffffffffffff;
              }
              local_68.dx_.ptr_to_data = (double *)operator_new__(uVar14);
              MEM_CPY<double>::copy
                        ((MEM_CPY<double> *)local_68.dx_.ptr_to_data,local_f8,
                         (EVP_PKEY_CTX *)(ulong)(uint)uVar5);
            }
            local_68.defaultVal = (double)pdStack_f0;
            local_48 = ABS(local_68.val_);
            uStack_40 = 0;
            Fad<double>::~Fad(&local_68);
            if (local_48 < 1e-12) {
              Error("Decompose_Cholesky <Zero on diagonal>",(char *)0x0);
            }
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      ((Fad<double> *)local_d8,this,lVar9,local_130);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_88,this,lVar9);
            local_128.val_ = (double)local_d8._0_8_ / (double)local_88._0_8_;
            uVar5 = local_d8._8_4_;
            uVar6 = local_88._8_4_;
            uVar4 = local_88._8_4_;
            if ((int)local_88._8_4_ < (int)local_d8._8_4_) {
              uVar4 = local_d8._8_4_;
            }
            local_128.dx_.num_elts = 0;
            local_128.dx_.ptr_to_data = (double *)0x0;
            if (0 < (int)uVar4) {
              uVar14 = (ulong)uVar4;
              local_128.dx_.num_elts = uVar4;
              local_128.dx_.ptr_to_data = (double *)operator_new__(uVar14 * 8);
              if (0 < (int)uVar4) {
                lVar9 = 0;
                do {
                  pdVar8 = (double *)((long)local_c8 + lVar9);
                  if (uVar5 == 0) {
                    pdVar8 = &local_c0;
                  }
                  pdVar11 = (double *)((long)local_78 + lVar9);
                  if (uVar6 == 0) {
                    pdVar11 = &local_70;
                  }
                  *(double *)((long)local_128.dx_.ptr_to_data + lVar9) =
                       (*pdVar8 * (double)local_88._0_8_ - (double)local_d8._0_8_ * *pdVar11) /
                       ((double)local_88._0_8_ * (double)local_88._0_8_);
                  lVar9 = lVar9 + 8;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
            }
            lVar9 = local_e0;
            local_128.defaultVal = 0.0;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,local_e0,local_130,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad((Fad<double> *)local_88);
            Fad<double>::~Fad((Fad<double> *)local_d8);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_128,this,lVar9,local_130);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,local_130,lVar9,&local_128);
            Fad<double>::~Fad(&local_128);
            Fad<double>::~Fad((Fad<double> *)local_108);
            local_130 = local_130 + 1;
          } while (local_130 < local_98);
        }
        Fad<double>::~Fad(&local_b8);
        lVar9 = local_90;
      } while (local_90 != local_98);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x03';
  }
  return 3;
}

Assistant:

int TPZMatrix<TVar>::Decompose_Cholesky() {
	if (  fDecomposed && fDecomposed != ECholesky) Error( "Decompose_Cholesky <Matrix already Decomposed>" );
	if (  fDecomposed ) return ECholesky;
	if ( Rows()!=Cols() ) Error( "Decompose_Cholesky <Matrix must be square>" );
	//return 0;
	
	int64_t dim=Dim();
	for (int64_t i=0 ; i<dim; i++) {
		for(int64_t k=0; k<i; k++) {//diagonal elements
            TVar sum = 0;
            if constexpr (is_complex<TVar>::value){
                sum += GetVal(i,k)*std::conj(GetVal(i,k));
            }else{
                sum += GetVal(i,k)*GetVal(i,k);
            }
            PutVal( i,i,GetVal(i,i)-sum );
		}
		TVar tmp = sqrt(GetVal(i,i));
        PutVal( i,i,tmp );
        for (int64_t j=i+1;j<dim; j++) {//off-diagonal elements
            for(int64_t k=0; k<i; k++) {
                TVar sum = 0.;
                if constexpr (is_complex<TVar>::value){
                    sum += GetVal(i,k)*std::conj(GetVal(j,k));
                }else{
                    sum += GetVal(i,k)*GetVal(j,k);
                }
                PutVal( i,j,GetVal(i,j)-sum);
            }
            TVar tmp2 = GetVal(i,i);
            if ( IsZero(tmp2) ) {
				Error( "Decompose_Cholesky <Zero on diagonal>" );
            }
            PutVal(i,j,GetVal(i,j)/GetVal(i,i) );
            if constexpr (is_complex<TVar>::value){
                PutVal(j,i,std::conj(GetVal(i,j)));
            }else{
                PutVal(j,i,GetVal(i,j));
            }
        }
    }
	fDecomposed = ECholesky;
	return ECholesky;
	
}